

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void rw::Engine::stop(void)

{
  PluginList *this;
  uint i;
  long lVar1;
  
  if ((engine == (void *)0x0) || (state != 3)) {
    stop();
  }
  else {
    this = (PluginList *)&Driver::s_plglist;
    lVar1 = 0;
    do {
      PluginList::destruct(this,*(void **)((long)engine + lVar1 * 8 + 0x20));
      lVar1 = lVar1 + 1;
      this = this + 1;
    } while (lVar1 != 0xd);
    PluginList::destruct((PluginList *)&s_plglist,engine);
    (**(code **)((long)engine + 0x108))(1,0,0);
    state = 2;
  }
  return;
}

Assistant:

void
Engine::stop(void)
{
	if(engine == nil || Engine::state != Started){
		RWERROR((ERR_GENERAL));
		return;
	}

	for(uint i = 0; i < NUM_PLATFORMS; i++)
		Driver::s_plglist[i].destruct(rw::engine->driver[i]);
	Engine::s_plglist.destruct(engine);

	engine->device.system(DEVICETERM, nil, 0);

	Engine::state = Opened;
}